

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

SQInteger __thiscall SQLexer::ReadID(SQLexer *this)

{
  LexChar LVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  ulong in_RAX;
  char *pcVar7;
  SQInteger SVar8;
  SQUnsignedInteger SVar9;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  sqvector<char,_unsigned_int>::resize(&this->_longstr,0,(char *)((long)&uStack_28 + 7));
  do {
    LVar1 = this->_currdata;
    uVar2 = (this->_longstr)._allocated;
    uVar3 = (this->_longstr)._size;
    if (uVar2 <= uVar3) {
      uVar3 = uVar3 * 2;
      SVar9 = (SQUnsignedInteger)uVar3;
      if (uVar3 == 0) {
        SVar9 = 4;
      }
      pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,(ulong)uVar2
                                     ,SVar9);
      (this->_longstr)._vals = pcVar7;
      (this->_longstr)._allocated = (size_type)SVar9;
    }
    uVar2 = (this->_longstr)._size;
    (this->_longstr)._size = uVar2 + 1;
    (this->_longstr)._vals[uVar2] = LVar1;
    uVar4 = this->_sourceTextPtr;
    if (uVar4 < this->_sourceTextSize) {
      this->_sourceTextPtr = uVar4 + 1;
      bVar5 = this->_sourceText[uVar4];
    }
    else {
      this->_reached_eof = 1;
      bVar5 = 0;
    }
    this->_currdata = bVar5;
    this->_currentcolumn = this->_currentcolumn + 1;
    iVar6 = isalnum((uint)bVar5);
  } while ((bVar5 == 0x5f) || (iVar6 != 0));
  uVar2 = (this->_longstr)._size;
  uVar3 = (this->_longstr)._allocated;
  if (uVar3 <= uVar2) {
    uVar2 = uVar2 * 2;
    SVar9 = 4;
    if (uVar2 != 0) {
      SVar9 = (SQUnsignedInteger)uVar2;
    }
    pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,(this->_longstr)._vals,(ulong)uVar3,
                                   SVar9);
    (this->_longstr)._vals = pcVar7;
    (this->_longstr)._allocated = (size_type)SVar9;
  }
  uVar2 = (this->_longstr)._size;
  (this->_longstr)._size = uVar2 + 1;
  (this->_longstr)._vals[uVar2] = '\0';
  SVar8 = GetIDType(this,(this->_longstr)._vals,(ulong)((this->_longstr)._size - 1));
  if ((SVar8 == 0x136) || (SVar8 == 0x102)) {
    this->_svalue = (this->_longstr)._vals;
  }
  return SVar8;
}

Assistant:

SQInteger SQLexer::ReadID()
{
    SQInteger res;
    INIT_TEMP_STRING();
    do {
        APPEND_CHAR(CUR_CHAR);
        NEXT();
    } while(isalnum(CUR_CHAR) || CUR_CHAR == _SC('_'));
    TERMINATE_BUFFER();
    res = GetIDType(&_longstr[0],_longstr.size() - 1);
    if(res == TK_IDENTIFIER || res == TK_CONSTRUCTOR) {
        SetStringValue();
    }
    return res;
}